

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void GEO::CmdLine::set_arg(string *name,bool value)

{
  string *psVar1;
  Environment *pEVar2;
  String local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  ArgType local_18;
  bool local_11;
  ArgType type;
  bool value_local;
  string *name_local;
  
  local_11 = value;
  _type = name;
  local_18 = get_arg_type(name);
  if ((local_18 & ~(ARG_BOOL|ARG_STRING)) != ARG_UNDEFINED) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"((type) & ~(ARG_BOOL | ARG_STRING)) == 0",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
               ,&local_71);
    geo_assertion_failed((string *)local_38,(string *)local_70,0xb5a);
  }
  pEVar2 = Environment::instance();
  psVar1 = _type;
  String::to_string<bool>(local_98,&local_11);
  (*(pEVar2->super_Counted)._vptr_Counted[4])(pEVar2,psVar1,local_98);
  std::__cxx11::string::~string((string *)local_98);
  return;
}

Assistant:

void set_arg(const std::string& name, bool value) {
            ArgType type = get_arg_type(name);
            geo_assert_arg_type(type, ARG_BOOL | ARG_STRING);
            Environment::instance()->set_value(name, String::to_string(value));
        }